

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wiener.cxx
# Opt level: O0

void __thiscall
WienerCpp::WienerCpp
          (WienerCpp *this,Time *time,double w,double n,double lambda,double n_rc,double lambda_rc)

{
  allocator<char> local_161;
  string local_160;
  allocator<char> local_139;
  string local_138;
  allocator<char> local_111;
  string local_110;
  allocator<char> local_e9;
  string local_e8;
  allocator<char> local_c1;
  string local_c0;
  allocator<char> local_99;
  string local_98;
  allocator<char> local_61;
  string local_60;
  double local_40;
  double lambda_rc_local;
  double n_rc_local;
  double lambda_local;
  double n_local;
  double w_local;
  Time *time_local;
  WienerCpp *this_local;
  
  local_40 = lambda_rc;
  lambda_rc_local = n_rc;
  n_rc_local = lambda;
  lambda_local = n;
  n_local = w;
  w_local = (double)time;
  time_local = (Time *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"Wiener Process",&local_99)
  ;
  Wiener::Wiener(&this->super_Wiener,time,&local_60,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  *(undefined ***)&this->super_Wiener = &PTR__WienerCpp_00191900;
  *(undefined ***)&(this->super_Wiener).field_0x60 = &PTR__WienerCpp_001919c0;
  *(undefined ***)&(this->super_Wiener).field_0x78 = &PTR__WienerCpp_00191a08;
  this->condW = n_local;
  this->condLambda = n_rc_local;
  this->condN = lambda_local;
  this->condCoincWidth = lambda_rc_local;
  this->condCoincRate = local_40;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"number-of-processes",&local_c1);
  Parametric::addParameter((Parametric *)this,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator(&local_c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"single-weight",&local_e9);
  Parametric::addParameter((Parametric *)this,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator(&local_e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,"single-rate",&local_111);
  Parametric::addParameter((Parametric *)this,&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator(&local_111);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"coincidence-width",&local_139);
  Parametric::addParameter((Parametric *)this,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator(&local_139);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_160,"coincidence-rate",&local_161);
  Parametric::addParameter((Parametric *)this,&local_160);
  std::__cxx11::string::~string((string *)&local_160);
  std::allocator<char>::~allocator(&local_161);
  (**(code **)(*(long *)&this->super_Wiener + 0x68))();
  return;
}

Assistant:

WienerCpp::WienerCpp( Time *time, double w, double n, double lambda, double n_rc, double lambda_rc ) : Wiener( time ) 
{
	condW = w;
	condLambda = lambda;
	condN = n;
	condCoincWidth = n_rc;
	condCoincRate = lambda_rc;
	addParameter("number-of-processes");
	addParameter("single-weight");
	addParameter("single-rate");
	addParameter("coincidence-width");
	addParameter("coincidence-rate");
	init();
}